

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_float.c
# Opt level: O2

vf_profile_t * vf_profile_default(vf_profile_t *__return_storage_ptr__,uint16_t bits)

{
  uint16_t exp;
  float fVar1;
  double dVar2;
  
  if (7 < bits) {
    if (bits < 0x41) {
      fVar1 = roundf((float)(int)(short)bits * 0.125);
      exp = *(uint16_t *)
             (&DAT_0015704e + ((long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1) * 2
             );
    }
    else {
      dVar2 = log((double)bits);
      dVar2 = round((dVar2 / 0.6931471805599453) * 4.0);
      exp = (uint16_t)(int)(dVar2 + -13.0);
    }
    vf_profile_custom(__return_storage_ptr__,bits,exp,~(-1L << ((char)exp - 1U & 0x3f)));
    return __return_storage_ptr__;
  }
  __assert_fail("bits >= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                ,0xc,"vf_profile_t vf_profile_default(const uint16_t)");
}

Assistant:

vf_profile_t vf_profile_default(const uint16_t bits) {
	assert(bits >= 8);
	static const uint16_t exponents[] = {3, 5, 7, 8, 8, 9, 10, 11};
	uint16_t exponent;
	if (bits <= 64) {
		exponent = exponents[(size_t)round((float)bits / 8) - 1];
	} else {
		// Formula for IEEE 754-1985 interchange formats:
		exponent = (uint16_t)(round(4 * (log(bits) / log(2))) - 13);
	}
	const vf_base_t bias = ((vf_base_t)1 << (exponent - 1)) - 1;
	return vf_profile_custom(bits, exponent, bias);
}